

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

QString * __thiscall QCss::Symbol::lexem(Symbol *this)

{
  bool bVar1;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int i;
  QString *result;
  QChar *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  QString *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  uint3 in_stack_ffffffffffffffdc;
  uint uVar3;
  QChar local_c;
  char16_t local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (uint)in_stack_ffffffffffffffdc;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QString::QString((QString *)0xa39c31);
  if (0 < *(int *)(in_RSI + 0x24)) {
    QString::reserve(this_00,CONCAT44(uVar3,in_stack_ffffffffffffffd8));
  }
  for (iVar2 = 0; iVar2 < *(int *)(in_RSI + 0x24); iVar2 = iVar2 + 1) {
    local_a = (char16_t)
              QString::at(in_RDI,CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    QChar::QChar<char16_t,_true>(&local_c,L'\\');
    bVar1 = ::operator==((QChar *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb7 = false;
    if (bVar1) {
      in_stack_ffffffffffffffb7 = iVar2 < *(int *)(in_RSI + 0x24) + -1;
    }
    if ((bool)in_stack_ffffffffffffffb7 != false) {
      iVar2 = iVar2 + 1;
    }
    QString::at(in_RDI,CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    QString::operator+=((QString *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                        (QChar)(char16_t)((ulong)in_RDI >> 0x30));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString Symbol::lexem() const
{
    QString result;
    if (len > 0)
        result.reserve(len);
    for (int i = 0; i < len; ++i) {
        if (text.at(start + i) == u'\\' && i < len - 1)
            ++i;
        result += text.at(start + i);
    }
    return result;
}